

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_0::Monomorphize::updateCall
          (Monomorphize *this,CallInfo *info,Name newTarget,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *newOperands,Module *wasm)

{
  _func_int **pp_Var1;
  PassRunner *pPVar2;
  
  pp_Var1 = (this->super_Pass)._vptr_Pass;
  pp_Var1[6] = (_func_int *)info;
  pp_Var1[7] = newTarget.super_IString.str._M_len;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             ((this->super_Pass)._vptr_Pass + 2),newTarget.super_IString.str._M_str);
  pPVar2 = (this->super_Pass).runner;
  if (pPVar2 != (PassRunner *)0x0) {
    pp_Var1 = (this->super_Pass)._vptr_Pass;
    if (pp_Var1[1] == (_func_int *)0x1) {
      __assert_fail("info.call->type != Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                    ,0x38d,
                    "void wasm::(anonymous namespace)::Monomorphize::updateCall(const CallInfo &, Name, const std::vector<Expression *> &, Module &)"
                   );
    }
    pp_Var1[1] = (_func_int *)0x0;
    pPVar2->_vptr_PassRunner = pp_Var1;
  }
  return;
}

Assistant:

void updateCall(const CallInfo& info,
                  Name newTarget,
                  const std::vector<Expression*>& newOperands,
                  Module& wasm) {
    info.call->target = newTarget;
    info.call->operands.set(newOperands);

    if (info.drop) {
      // Replace (drop (call)) with (call), that is, replace the drop with the
      // (updated) call which now has type none. Note we should have handled
      // unreachability before getting here.
      assert(info.call->type != Type::unreachable);
      info.call->type = Type::none;
      *info.drop = info.call;
    }
  }